

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ScanLineInputFile::readPixels(ScanLineInputFile *this,int scanLine1,int scanLine2)

{
  value_type pLVar1;
  size_type sVar2;
  ArgExc *pAVar3;
  int *piVar4;
  int *piVar5;
  Task *pTVar6;
  reference ppLVar7;
  IoExc *this_00;
  InputStreamMutex *in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  LineBuffer *lineBuffer;
  size_t i;
  string *exception;
  int l;
  TaskGroup taskGroup;
  int dl;
  int stop;
  int start;
  int scanLineMax;
  int scanLineMin;
  Lock lock;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  Mutex *in_stack_fffffffffffffda8;
  Lock *in_stack_fffffffffffffdb0;
  Data *in_stack_fffffffffffffdf0;
  TaskGroup *in_stack_fffffffffffffe00;
  OptimizationMode in_stack_fffffffffffffe10;
  ulong local_68;
  string *local_60;
  int local_4c;
  TaskGroup local_48 [8];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_10;
  int local_c [3];
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(bool)in_stack_fffffffffffffda7);
  sVar2 = std::
          vector<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
                  *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) + 0x100
                    ));
  if (sVar2 == 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  piVar4 = std::min<int>(local_c,&local_10);
  local_30 = *piVar4;
  piVar5 = std::max<int>(local_c,&local_10);
  local_34 = *piVar5;
  if ((*(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) + 0xa4) <=
       local_30) &&
     (local_34 <=
      *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) + 0xa8))) {
    if (*(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) + 0x98) ==
        0) {
      local_38 = (local_30 -
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0xa4)) /
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0x130);
      local_3c = (local_34 -
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0xa4)) /
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0x130) + 1;
      local_40 = 1;
    }
    else {
      local_38 = (local_34 -
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0xa4)) /
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0x130);
      local_3c = (local_30 -
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0xa4)) /
                 *(int *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                         0x130) + -1;
      local_40 = -1;
    }
    IlmThread_2_5::TaskGroup::TaskGroup(local_48);
    for (local_4c = local_38; local_4c != local_3c; local_4c = local_40 + local_4c) {
      pTVar6 = anon_unknown_6::newLineBufferTask
                         (in_stack_fffffffffffffe00,in_RDI,in_stack_fffffffffffffdf0,
                          (int)((ulong)piVar4 >> 0x20),(int)piVar4,(int)((ulong)piVar5 >> 0x20),
                          in_stack_fffffffffffffe10);
      IlmThread_2_5::ThreadPool::addGlobalTask(pTVar6);
    }
    IlmThread_2_5::TaskGroup::~TaskGroup(local_48);
    local_60 = (string *)0x0;
    local_68 = 0;
    while( true ) {
      sVar2 = std::
              vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                      *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex + 8) +
                        0x118));
      if (sVar2 <= local_68) break;
      ppLVar7 = std::
                vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                              *)(*(long *)((long)&(in_RDI->super_Mutex).super___mutex_base._M_mutex
                                          + 8) + 0x118),local_68);
      pLVar1 = *ppLVar7;
      if (((pLVar1->scanLineMin & 1) != 0) && (local_60 == (string *)0x0)) {
        local_60 = (string *)&pLVar1->compressor;
      }
      *(undefined1 *)&pLVar1->scanLineMin = 0;
      local_68 = local_68 + 1;
    }
    if (local_60 != (string *)0x0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_00,local_60);
      __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    return;
  }
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar3,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
ScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_streamData);

	if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data destination.");

	int scanLineMin = min (scanLine1, scanLine2);
	int scanLineMax = max (scanLine1, scanLine2);

	if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
	    throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			       "the image file's data window.");

        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //
        
        {
            TaskGroup taskGroup;
    
            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
	    // for a successive task to execute the previous task which
	    // used that line buffer must have completed already.
            //
    
            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _streamData,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax,
                                                              _data->optimizationMode));
            }
        
	    //
            // finish all tasks
	    //
        }
        
	//
	// Exeption handling:
	//
	// LineBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to ScanLineInputFile::readPixels().
	// LineBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the line buffers.
	// Now we check if any line buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple line buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
	{
            LineBuffer *lineBuffer = _data->lineBuffers[i];

	    if (lineBuffer->hasException && !exception)
		exception = &lineBuffer->exception;

	    lineBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}